

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O0

result_type __thiscall
anon_unknown.dwarf_4c1f8f::IsInvalidName::operator()(IsInvalidName *this,QString *name)

{
  bool bVar1;
  QString *in_RSI;
  long in_FS_OFFSET;
  QChar c;
  undefined4 in_stack_ffffffffffffffc8;
  CaseSensitivity in_stack_ffffffffffffffcc;
  QChar *in_stack_ffffffffffffffd0;
  QString *pQVar2;
  bool local_11;
  QChar local_10;
  QChar local_e;
  QChar local_c;
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1f8626);
  if (bVar1) {
    local_11 = warn((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    local_a = 0xaaaa;
    local_a = (char16_t)QString::at(in_RSI,(qsizetype)in_stack_ffffffffffffffd0);
    QChar::QChar<char16_t,_true>(&local_c,L'-');
    bVar1 = ::operator==(in_stack_ffffffffffffffd0,
                         (QChar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      local_11 = warn((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      QChar::QChar<char16_t,_true>(&local_e,L'/');
      bVar1 = ::operator==(in_stack_ffffffffffffffd0,
                           (QChar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (bVar1) {
        local_11 = warn((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else {
        pQVar2 = in_RSI;
        QChar::QChar<char16_t,_true>(&local_10,L'=');
        bVar1 = QString::contains(in_RSI,(QChar)(char16_t)((ulong)pQVar2 >> 0x30),
                                  in_stack_ffffffffffffffcc);
        if (bVar1) {
          local_11 = warn((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        else {
          local_11 = false;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

operator()(const QString &name) const noexcept
        {
            if (Q_UNLIKELY(name.isEmpty()))
                return warn("be empty");

            const QChar c = name.at(0);
            if (Q_UNLIKELY(c == u'-'))
                return warn("start with a '-'");
            if (Q_UNLIKELY(c == u'/'))
                return warn("start with a '/'");
            if (Q_UNLIKELY(name.contains(u'=')))
                return warn("contain a '='");

            return false;
        }